

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

_Bool ossl_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  SSL *s;
  int iVar1;
  
  s = *(SSL **)(*(long *)((long)cf->ctx + 0x30) + 8);
  if (s != (SSL *)0x0) {
    iVar1 = SSL_pending(s);
    if (iVar1 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool ossl_data_pending(struct Curl_cfilter *cf,
                              const struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;

  (void)data;
  DEBUGASSERT(connssl && backend);
  if(backend->handle && SSL_pending(backend->handle))
    return TRUE;
  return FALSE;
}